

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::TestXmlTestReporterFixtureFailureMessageIsXMLEscaped::
~TestXmlTestReporterFixtureFailureMessageIsXMLEscaped
          (TestXmlTestReporterFixtureFailureMessageIsXMLEscaped *this)

{
  TestXmlTestReporterFixtureFailureMessageIsXMLEscaped *this_local;
  
  ~TestXmlTestReporterFixtureFailureMessageIsXMLEscaped(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, FailureMessageIsXMLEscaped)
{
    TestDetails const details("TestName", "suite", "filename.h", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "\"\'&<>");
    reporter.ReportTestFinish(details, 0.1f);
    reporter.ReportSummary(1, 1, 1, 0.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"TestName\" time=\"0.1\">"
        "<failure message=\"filename.h(4321) : &quot;&apos;&amp;&lt;&gt;\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}